

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeevents.cpp
# Opt level: O2

void __thiscall
YAML::NodeEvents::Emit(NodeEvents *this,node *node,EventHandler *handler,AliasManager *am)

{
  element_type *peVar1;
  bool bVar2;
  anchor_t aVar3;
  value vVar4;
  const_node_iterator __begin2;
  value_type element;
  const_node_iterator __end2;
  const_node_iterator local_88;
  node *local_68;
  node *local_60;
  node *local_58;
  const_node_iterator local_50;
  
  bVar2 = IsAliased(this,node);
  vVar4 = Undefined;
  if (bVar2) {
    aVar3 = AliasManager::LookupAnchor(am,node);
    if (aVar3 != 0) {
      local_88.m_type = NoneType;
      local_88._4_4_ = 0;
      local_88.m_seqIt._M_current._0_4_ = 0;
      (*handler->_vptr_EventHandler[5])(handler,&local_88,aVar3);
      return;
    }
    AliasManager::RegisterReference(am,node);
    aVar3 = AliasManager::LookupAnchor(am,node);
  }
  else {
    aVar3 = 0;
  }
  peVar1 = (((node->m_pRef).super___shared_ptr<YAML::detail::node_ref,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->m_pData).
           super___shared_ptr<YAML::detail::node_data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->m_isDefined != false) {
    vVar4 = peVar1->m_type;
  }
  switch(vVar4) {
  case Null:
    local_88.m_type = NoneType;
    local_88._4_4_ = 0;
    local_88.m_seqIt._M_current._0_4_ = 0;
    (*handler->_vptr_EventHandler[4])(handler,&local_88,aVar3);
    break;
  case Scalar:
    local_88.m_type = NoneType;
    local_88._4_4_ = 0;
    local_88.m_seqIt._M_current._0_4_ = 0;
    (*handler->_vptr_EventHandler[6])(handler,&local_88,&peVar1->m_tag,aVar3,&peVar1->m_scalar);
    break;
  case Sequence:
    local_88.m_type = NoneType;
    local_88._4_4_ = 0;
    local_88.m_seqIt._M_current._0_4_ = 0;
    (*handler->_vptr_EventHandler[7])(handler,&local_88,&peVar1->m_tag,aVar3,(ulong)peVar1->m_style)
    ;
    detail::node::begin(&local_88,node);
    detail::node::end(&local_50,node);
    while (bVar2 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                             ((node_iterator_base<YAML::detail::node_const> *)&local_88,&local_50),
          bVar2) {
      detail::node_iterator_base<const_YAML::detail::node>::operator*(&local_88);
      Emit(this,local_58,handler,am);
      detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_88);
    }
    (*handler->_vptr_EventHandler[8])(handler);
    break;
  case Map:
    local_88.m_type = NoneType;
    local_88._4_4_ = 0;
    local_88.m_seqIt._M_current._0_4_ = 0;
    (*handler->_vptr_EventHandler[9])(handler,&local_88,&peVar1->m_tag,aVar3,(ulong)peVar1->m_style)
    ;
    detail::node::begin(&local_88,node);
    detail::node::end(&local_50,node);
    while (bVar2 = detail::node_iterator_base<YAML::detail::node_const>::operator!=
                             ((node_iterator_base<YAML::detail::node_const> *)&local_88,&local_50),
          bVar2) {
      detail::node_iterator_base<const_YAML::detail::node>::operator*(&local_88);
      Emit(this,local_68,handler,am);
      Emit(this,local_60,handler,am);
      detail::node_iterator_base<const_YAML::detail::node>::operator++(&local_88);
    }
    (*handler->_vptr_EventHandler[10])(handler);
  }
  return;
}

Assistant:

void NodeEvents::Emit(const detail::node& node, EventHandler& handler,
                      AliasManager& am) const {
  anchor_t anchor = NullAnchor;
  if (IsAliased(node)) {
    anchor = am.LookupAnchor(node);
    if (anchor) {
      handler.OnAlias(Mark(), anchor);
      return;
    }

    am.RegisterReference(node);
    anchor = am.LookupAnchor(node);
  }

  switch (node.type()) {
    case NodeType::Undefined:
      break;
    case NodeType::Null:
      handler.OnNull(Mark(), anchor);
      break;
    case NodeType::Scalar:
      handler.OnScalar(Mark(), node.tag(), anchor, node.scalar());
      break;
    case NodeType::Sequence:
      handler.OnSequenceStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node)
        Emit(*element, handler, am);
      handler.OnSequenceEnd();
      break;
    case NodeType::Map:
      handler.OnMapStart(Mark(), node.tag(), anchor, node.style());
      for (auto element : node) {
        Emit(*element.first, handler, am);
        Emit(*element.second, handler, am);
      }
      handler.OnMapEnd();
      break;
  }
}